

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

int gdImageColorClosestAlpha(gdImagePtr im,int r,int g,int b,int a)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  if (im->trueColor != 0) {
    return b + a * 0x1000000 + g * 0x100 + r * 0x10000;
  }
  if (0 < (long)im->colorsTotal) {
    uVar2 = 0xffffffff;
    bVar1 = 1;
    uVar3 = 0;
    lVar4 = 0;
    do {
      if (im->open[uVar3] == 0) {
        lVar8 = (long)im->red[uVar3] - (long)r;
        lVar5 = (long)im->green[uVar3] - (long)g;
        lVar6 = (long)im->blue[uVar3] - (long)b;
        lVar7 = (long)im->alpha[uVar3] - (long)a;
        lVar5 = lVar7 * lVar7 + lVar6 * lVar6 + lVar5 * lVar5 + lVar8 * lVar8;
        if ((bool)(lVar5 < lVar4 | bVar1)) {
          uVar2 = uVar3 & 0xffffffff;
          lVar4 = lVar5;
        }
        bVar1 = 0;
      }
      uVar3 = uVar3 + 1;
    } while ((long)im->colorsTotal != uVar3);
    return (int)uVar2;
  }
  return -1;
}

Assistant:

BGD_DECLARE(int) gdImageColorClosestAlpha (gdImagePtr im, int r, int g, int b, int a)
{
	int i;
	long rd, gd, bd, ad;
	int ct = (-1);
	int first = 1;
	long mindist = 0;
	if (im->trueColor) {
		return gdTrueColorAlpha (r, g, b, a);
	}
	for (i = 0; (i < (im->colorsTotal)); i++) {
		long dist;
		if (im->open[i]) {
			continue;
		}
		rd = (im->red[i] - r);
		gd = (im->green[i] - g);
		bd = (im->blue[i] - b);
		/* gd 2.02: whoops, was - b (thanks to David Marwood) */
		/* gd 2.16: was blue rather than alpha! Geez! Thanks to
		   Artur Jakub Jerzak */
		ad = (im->alpha[i] - a);
		dist = rd * rd + gd * gd + bd * bd + ad * ad;
		if (first || (dist < mindist)) {
			mindist = dist;
			ct = i;
			first = 0;
		}
	}
	return ct;
}